

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.h
# Opt level: O2

char * glslang::TQualifier::getInterlockOrderingString(TInterlockOrdering order)

{
  if (order - EioPixelInterlockOrdered < 6) {
    return &DAT_007292a0 + *(int *)(&DAT_007292a0 + (ulong)(order - EioPixelInterlockOrdered) * 4);
  }
  return "none";
}

Assistant:

static const char* getInterlockOrderingString(TInterlockOrdering order)
    {
        switch (order) {
        case EioPixelInterlockOrdered:          return "pixel_interlock_ordered";
        case EioPixelInterlockUnordered:        return "pixel_interlock_unordered";
        case EioSampleInterlockOrdered:         return "sample_interlock_ordered";
        case EioSampleInterlockUnordered:       return "sample_interlock_unordered";
        case EioShadingRateInterlockOrdered:    return "shading_rate_interlock_ordered";
        case EioShadingRateInterlockUnordered:  return "shading_rate_interlock_unordered";
        default:                                return "none";
        }
    }